

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.cc
# Opt level: O0

size_type __thiscall wabt::string_view::find_last_of(string_view *this,string_view s,size_type pos)

{
  bool bVar1;
  unsigned_long *puVar2;
  const_iterator pcVar3;
  long lVar4;
  size_type local_98;
  undefined1 local_58 [16];
  string_view local_48;
  reverse_iterator<const_char_*> local_38;
  reverse_iterator iter;
  size_type local_28;
  size_type pos_local;
  string_view *this_local;
  string_view s_local;
  
  s_local.data_ = (char *)s.size_;
  this_local = (string_view *)s.data_;
  iter.current = (char *)(this->size_ - 1);
  local_28 = pos;
  pos_local = (size_type)this;
  puVar2 = std::min<unsigned_long>(&local_28,(unsigned_long *)&iter);
  local_28 = *puVar2;
  pcVar3 = begin(this);
  std::reverse_iterator<const_char_*>::reverse_iterator
            ((reverse_iterator<const_char_*> *)&local_48.size_,pcVar3 + local_28 + 1);
  rend(&local_48);
  pcVar3 = begin((string_view *)&this_local);
  end((string_view *)&this_local);
  std::find_first_of<std::reverse_iterator<char_const*>,char_const*>
            (&local_38,(reverse_iterator<const_char_*> *)&local_48.size_,(char *)&local_48,pcVar3);
  rend((string_view *)(local_58 + 8));
  bVar1 = std::operator==(&local_38,(reverse_iterator<const_char_*> *)(local_58 + 8));
  if (bVar1) {
    local_98 = 0xffffffffffffffff;
  }
  else {
    rend((string_view *)local_58);
    lVar4 = std::operator-((reverse_iterator<const_char_*> *)local_58,&local_38);
    local_98 = lVar4 - 1;
  }
  return local_98;
}

Assistant:

string_view::size_type string_view::find_last_of(string_view s,
                                                 size_type pos) const noexcept {
  pos = std::min(pos, size_ - 1);
  reverse_iterator iter = std::find_first_of(
      reverse_iterator(begin() + (pos + 1)), rend(), s.begin(), s.end());
  return iter == rend() ? npos : (rend() - iter - 1);
}